

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_base_swaps<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
               (void)

{
  template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
  *this;
  Dimension DVar1;
  uint uVar2;
  uint uVar3;
  pointer ppVar4;
  pointer puVar5;
  Field_operators *pFVar6;
  Entry_constructor *pEVar7;
  Entry_constructor *pEVar8;
  pointer ppVar9;
  pointer ppVar10;
  pointer ppVar11;
  pointer ppVar12;
  pointer ppVar13;
  Column_settings *pCVar14;
  Column_settings *pCVar15;
  pointer pIVar16;
  pointer pIVar17;
  Column_zp_settings *this_00;
  uint uVar18;
  ulong uVar19;
  undefined8 uVar20;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_> m;
  uint local_1a8 [8];
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_188;
  Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>
  local_170;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>>
            ();
  this_00 = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>::
  Column_zp_settings::Column_zp_settings(this_00,5);
  local_170.colSettings_ = this_00;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
  ::
  Boundary_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
              *)&local_170.matrix_,&local_188,this_00);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
            (&local_188,&local_170);
  pIVar16 = local_170.matrix_.matrix_.
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar19 = ((long)local_170.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_170.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  if (uVar19 < 4) {
    uVar20 = 3;
  }
  else {
    uVar20 = 5;
    if (5 < uVar19) {
      DVar1 = local_170.matrix_.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].super_Column_dimension_option.dim_;
      local_170.matrix_.matrix_.
      super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[3].super_Column_dimension_option.dim_ =
           local_170.matrix_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_;
      local_170.matrix_.matrix_.
      super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_ = DVar1;
      boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
      swap_nodes((node_ptr)
                 &local_170.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[3].column_,
                 (node_ptr)
                 &local_170.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[5].column_);
      pIVar17 = local_170.matrix_.matrix_.
                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar6 = pIVar16[3].operators_;
      pEVar7 = pIVar16[3].entryPool_;
      pEVar8 = pIVar16[5].entryPool_;
      pIVar16[3].operators_ = pIVar16[5].operators_;
      pIVar16[3].entryPool_ = pEVar8;
      pIVar16[5].operators_ = pFVar6;
      pIVar16[5].entryPool_ = pEVar7;
      if (5 < (ulong)(((long)local_170.matrix_.matrix_.
                             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_170.matrix_.matrix_.
                             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))
      {
        DVar1 = local_170.matrix_.matrix_.
                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_;
        local_170.matrix_.matrix_.
        super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_ =
             local_170.matrix_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].super_Column_dimension_option.dim_;
        local_170.matrix_.matrix_.
        super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].super_Column_dimension_option.dim_ = DVar1;
        boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
        swap_nodes((node_ptr)
                   &local_170.matrix_.matrix_.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].column_,
                   (node_ptr)
                   &local_170.matrix_.matrix_.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].column_);
        pEVar7 = pIVar17[1].entryPool_;
        pFVar6 = pIVar17[5].operators_;
        pEVar8 = pIVar17[5].entryPool_;
        pIVar17[5].operators_ = pIVar17[1].operators_;
        pIVar17[5].entryPool_ = pEVar7;
        pIVar17[1].operators_ = pFVar6;
        pIVar17[1].entryPool_ = pEVar8;
        ppVar4 = local_188.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_188.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_188.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_188.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_188.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar9 = local_188.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar10 = local_188.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[3].
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppVar11 = local_188.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[5].
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar12 = local_188.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[5].
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppVar13 = local_188.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_188.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_188.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_188.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar13;
        local_188.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = ppVar11;
        local_188.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar12;
        local_188.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = ppVar9;
        local_188.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar10;
        local_188.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar4;
        test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
                  (&local_188,&local_170);
        this = &local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
        ;
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowSwapped_ = true;
        uVar19 = (long)local_170.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_170.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        if (uVar19 < 6) {
          do {
            local_1a8[0] = (uint)uVar19;
            if (local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&this->indexToRow_,
                         (iterator)
                         local_170.matrix_.
                         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                         .indexToRow_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_1a8);
            }
            else {
              *local_170.matrix_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
               .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_1a8[0];
              local_170.matrix_.
              super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
              .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_170.matrix_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != 6);
          uVar19 = (long)local_170.matrix_.
                         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                         .indexToRow_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_170.matrix_.
                         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                         .indexToRow_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
        }
        uVar18 = local_170.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[5];
        uVar2 = local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start
                [local_170.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[3]];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start
        [local_170.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
         .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[3]] =
             local_170.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
             .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar18];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar18] = uVar2;
        uVar18 = local_170.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[3];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[3] =
             local_170.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
             .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[5];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[5] = uVar18;
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowSwapped_ = true;
        if (uVar19 < 6) {
          do {
            local_1a8[0] = (uint)uVar19;
            if (local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&this->indexToRow_,
                         (iterator)
                         local_170.matrix_.
                         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                         .indexToRow_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_1a8);
            }
            else {
              *local_170.matrix_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
               .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_1a8[0];
              local_170.matrix_.
              super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
              .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_170.matrix_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != 6);
          uVar18 = local_170.matrix_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[5];
        }
        uVar2 = local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[1];
        uVar3 = local_170.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[uVar18];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar18] =
             local_170.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
             .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar2];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] = uVar3;
        uVar18 = local_170.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[5];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[5] =
             local_170.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
             .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1];
        local_170.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options<false,_(Column_types)7,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[1] = uVar18;
        local_1a8[0] = 2;
        local_1a8[1] = 4;
        local_1a8[2] = 5;
        local_1a8[3] = 1;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)(local_188.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4),local_1a8);
        local_1a8[0] = 1;
        local_1a8[1] = 1;
        local_1a8[2] = 3;
        local_1a8[3] = 4;
        local_1a8[4] = 4;
        local_1a8[5] = 1;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)(local_188.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 6),local_1a8);
        local_1a8[0] = 0;
        local_1a8[1] = 1;
        local_1a8[2] = 5;
        local_1a8[3] = 4;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)(local_188.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1),local_1a8);
        test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true>>>
                  (&local_188,&local_170);
        pCVar14 = local_170.colSettings_;
        std::
        vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
        ::_M_erase_at_end(&local_170.matrix_.matrix_,
                          local_170.matrix_.matrix_.
                          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        pCVar15 = local_170.colSettings_;
        local_170.matrix_.nextInsertIndex_ = 0;
        local_170.matrix_.colSettings_ = pCVar14;
        if (local_170.colSettings_ != (Column_zp_settings *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
                    ((pool<boost::default_user_allocator_malloc_free> *)
                     &(local_170.colSettings_)->entryConstructor);
          puVar5 = (pCVar15->operators).inverse_.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar5 != (pointer)0x0) {
            operator_delete(puVar5,(long)(pCVar15->operators).inverse_.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar5);
          }
        }
        operator_delete(pCVar15,0x58);
        Gudhi::persistence_matrix::
        Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true>_>_>
        ::~Boundary_matrix(&local_170.matrix_);
        std::
        vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ::~vector(&local_188);
        return;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20);
}

Assistant:

void test_base_swaps() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.swap_columns(3, 5);
  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    m.swap_columns(3, 1);
  } else {
    m.swap_columns(5, 1);
    columns[3].swap(columns[5]);
    columns[5].swap(columns[1]);
  }

  test_content_equality(columns, m);

  m.swap_rows(3, 5);
  m.swap_rows(5, 1);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[4] = {2, 5};
    columns[6] = {1, 3, 4};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {0, 5};
      columns[5] = {0, 2};
    } else {
      columns[1] = {0, 5};
    }
  } else {
    columns[4] = {{2, 4}, {5, 1}};
    columns[6] = {{1, 1}, {3, 4}, {4, 1}};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {{0, 1}, {5, 4}};
      columns[5] = {{0, 1}, {2, 4}};
    } else {
      columns[1] = {{0, 1}, {5, 4}};
    }
  }

  test_content_equality(columns, m);
}